

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffc_params.c
# Opt level: O0

void ossl_ffc_params_get0_pqg(FFC_PARAMS *d,BIGNUM **p,BIGNUM **q,BIGNUM **g)

{
  BIGNUM **g_local;
  BIGNUM **q_local;
  BIGNUM **p_local;
  FFC_PARAMS *d_local;
  
  if (p != (BIGNUM **)0x0) {
    *p = d->p;
  }
  if (q != (BIGNUM **)0x0) {
    *q = d->q;
  }
  if (g != (BIGNUM **)0x0) {
    *g = d->g;
  }
  return;
}

Assistant:

void ossl_ffc_params_get0_pqg(const FFC_PARAMS *d, const BIGNUM **p,
                              const BIGNUM **q, const BIGNUM **g)
{
    if (p != NULL)
        *p = d->p;
    if (q != NULL)
        *q = d->q;
    if (g != NULL)
        *g = d->g;
}